

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_widgets.h
# Opt level: O3

void __thiscall
dlib::button::set_click_handler<dlib::message_box_helper::blocking_box_win>
          (button *this,blocking_box_win *object,mfp_pointer_type event_handler_)

{
  _Head_base<0UL,_dlib::any_function<void_(dlib::button_&),_void,_1UL>::Tbase<void_(dlib::button_&)>_*,_false>
  _Var1;
  pointer *__ptr;
  auto_mutex M;
  member_function_pointer<void,_void,_void,_void> temp;
  _Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false> local_88;
  auto_mutex local_80;
  undefined **local_68 [6];
  member_function_pointer<void,_void,_void,_void> *local_38;
  
  local_80.r = (this->super_button_action).super_mouse_over_event.super_drawable.m;
  local_80.m = (mutex *)0x0;
  local_80.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_80.r,1);
  local_38 = (member_function_pointer<void,_void,_void,_void> *)local_68;
  local_68[2]._0_4_ = 0;
  local_68[0] = &PTR__mp_base_base_00316970;
  local_68[1] = (undefined **)object;
  local_68[3] = (undefined **)event_handler_;
  any_function<void(),void,0ul>::any_function<dlib::member_function_pointer<void,void,void,void>>
            ((any_function<void(),void,0ul> *)&local_88,local_38);
  any_function<void_(),_void,_0UL>::operator=
            (&this->event_handler,(any_function<void_(),_void,_0UL> *)&local_88);
  if (local_88._M_head_impl != (Tbase<void_()> *)0x0) {
    (*(local_88._M_head_impl)->_vptr_Tbase[1])();
  }
  local_88._M_head_impl = (Tbase<void_()> *)0x0;
  (**(local_38->super_mfp_kernel_1_base_class<0UL>).mp_memory.mem.void_ptr)();
  _Var1._M_head_impl =
       (this->event_handler_self).data._M_t.
       super___uniq_ptr_impl<dlib::any_function<void_(dlib::button_&),_void,_1UL>::Tbase<void_(dlib::button_&)>,_std::default_delete<dlib::any_function<void_(dlib::button_&),_void,_1UL>::Tbase<void_(dlib::button_&)>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_dlib::any_function<void_(dlib::button_&),_void,_1UL>::Tbase<void_(dlib::button_&)>_*,_std::default_delete<dlib::any_function<void_(dlib::button_&),_void,_1UL>::Tbase<void_(dlib::button_&)>_>_>
       .
       super__Head_base<0UL,_dlib::any_function<void_(dlib::button_&),_void,_1UL>::Tbase<void_(dlib::button_&)>_*,_false>
       ._M_head_impl;
  (this->event_handler_self).data._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(dlib::button_&),_void,_1UL>::Tbase<void_(dlib::button_&)>,_std::default_delete<dlib::any_function<void_(dlib::button_&),_void,_1UL>::Tbase<void_(dlib::button_&)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(dlib::button_&),_void,_1UL>::Tbase<void_(dlib::button_&)>_*,_std::default_delete<dlib::any_function<void_(dlib::button_&),_void,_1UL>::Tbase<void_(dlib::button_&)>_>_>
  .
  super__Head_base<0UL,_dlib::any_function<void_(dlib::button_&),_void,_1UL>::Tbase<void_(dlib::button_&)>_*,_false>
  ._M_head_impl = (Tbase<void_(dlib::button_&)> *)0x0;
  if (_Var1._M_head_impl != (Tbase<void_(dlib::button_&)> *)0x0) {
    (**(code **)(*(long *)_Var1._M_head_impl + 8))();
  }
  auto_mutex::unlock(&local_80);
  return;
}

Assistant:

void set_click_handler (
            T& object,
            void (T::*event_handler_)()
        )
        {
            auto_mutex M(m);
            event_handler = make_mfp(object,event_handler_);
            event_handler_self.clear();
        }